

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O1

_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
 XPMP2::
 iterRnd<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::pair<XPMP2::CSLModel*,XPMP2::CSLModel::MatchCritTy_const*>>>>
           (_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
            lower,_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
                  upper)

{
  int iVar1;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
  _Var2;
  long lVar3;
  long lVar4;
  
  lVar3 = 0;
  _Var2._M_node = lower._M_node;
  if (lower._M_node != upper._M_node) {
    do {
      _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node);
      lVar3 = lVar3 + 1;
    } while (_Var2._M_node != upper._M_node);
  }
  _Var2._M_node = upper._M_node;
  if ((0 < lVar3) && (_Var2._M_node = lower._M_node, lVar3 != 1)) {
    iVar1 = rand();
    lVar4 = (long)((float)lVar3 * (float)iVar1 * 4.656613e-10);
    if (lVar3 <= lVar4) {
      _Var2._M_node = (_Base_ptr)std::_Rb_tree_decrement(upper._M_node);
      return (_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
              )_Var2._M_node;
    }
    if (lVar4 < 1) {
      for (; _Var2._M_node = lower._M_node, lVar4 != 0; lVar4 = lVar4 + 1) {
        lower._M_node = (_Base_ptr)std::_Rb_tree_decrement(lower._M_node);
      }
    }
    else {
      do {
        _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node);
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  return (_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
          )_Var2._M_node;
}

Assistant:

IteratorT iterRnd (IteratorT lower, IteratorT upper)
{
    const long dist = (long)std::distance(lower, upper);
    // Does the range (cslUpper excluded!) not contain anything?
    if (dist <= 0)
        return upper;
    // Does the "range" only contain exactly one element? Then shortcut the search
    if (dist == 1)
        return lower;
    // Contains more than one, so make a random choice
    const float rnd = float(std::rand()) / float(RAND_MAX); // should be less than 1.0
    const long adv = long(rnd * dist);                      // therefor, should be less than `dist`
    if (adv < dist)                                         // but let's make sure
        std::advance(lower, long(adv));
    else
        lower = std::prev(upper);
    return lower;
}